

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O2

void * ulist_getNext_63(UList *list)

{
  UListNode *pUVar1;
  
  if ((list != (UList *)0x0) && (pUVar1 = list->curr, pUVar1 != (UListNode *)0x0)) {
    list->curr = pUVar1->next;
    return pUVar1->data;
  }
  return (void *)0x0;
}

Assistant:

U_CAPI void *U_EXPORT2 ulist_getNext(UList *list) {
    UListNode *curr = NULL;
    
    if (list == NULL || list->curr == NULL) {
        return NULL;
    }
    
    curr = list->curr;
    list->curr = curr->next;
    
    return curr->data;
}